

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

type __thiscall
jsoncons::
sorted_json_object<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>,std::vector>
::
insert_or_assign<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>,std::pmr::polymorphic_allocator<char>>
          (sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>,_std::vector>
           *this,string_view_type *name,
          basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *value)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *__args;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  allocator_holder<std::pmr::polymorphic_allocator<char>_> *in_RDI;
  pair<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>,_bool>
  pVar2;
  type tVar3;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
  it;
  bool inserted;
  vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe58;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
  *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
  *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *this_01;
  size_t in_stack_fffffffffffffe78;
  const_iterator __position;
  char *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  local_120;
  memory_resource *local_e8;
  size_t local_d0;
  char *local_c8;
  __sv_type local_c0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *local_b0;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *local_a8;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *local_a0;
  memory_resource *local_88;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *local_58;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *local_48;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
  *local_40;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
  local_38;
  bool local_29;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  
  local_20 = in_RSI;
  local_40 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
              *)std::
                vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                ::begin(in_stack_fffffffffffffe58);
  local_48 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
              *)std::
                vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                ::end(in_stack_fffffffffffffe58);
  local_38 = std::
             lower_bound<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*,std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>>,std::basic_string_view<char,std::char_traits<char>>,jsoncons::sorted_json_object<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>,std::vector>::Comp>
                       (local_40,local_48,local_20);
  local_58 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
              *)std::
                vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                ::end(in_stack_fffffffffffffe58);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffe60,
                     (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffe58);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::begin(local_20);
    std::basic_string_view<char,_std::char_traits<char>_>::end(local_20);
    local_88 = (memory_resource *)
               allocator_holder<std::pmr::polymorphic_allocator<char>_>::get_allocator(in_RDI);
    std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>::
    basic_string<char_const*,void>
              (in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
               (char *)in_stack_fffffffffffffe60,
               (polymorphic_allocator<char> *)in_stack_fffffffffffffe58);
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
    ::
    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
              ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_> *)
               in_stack_fffffffffffffe60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                     *)0xdb812a);
    local_29 = true;
    local_b0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                *)std::
                  vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                  ::begin(in_stack_fffffffffffffe58);
    std::
    vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
    ::size((vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
            *)(in_RDI + 1));
    local_a8 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                *)__gnu_cxx::
                  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                  ::operator+((__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffe68,
                              (difference_type)in_stack_fffffffffffffe60);
    local_a0 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
                *)__gnu_cxx::
                  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                  ::operator-((__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffffe68,
                              (difference_type)in_stack_fffffffffffffe60);
    local_38 = (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                )local_a0;
  }
  else {
    this_00 = __gnu_cxx::
              __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
              ::operator*(&local_38);
    key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
    ::key(this_00);
    local_c0 = std::__cxx11::basic_string::operator_cast_to_basic_string_view
                         (&in_stack_fffffffffffffe60->key_);
    local_d0 = local_20->_M_len;
    local_c8 = local_20->_M_str;
    __x._M_str = in_stack_fffffffffffffe90;
    __x._M_len = in_stack_fffffffffffffe88;
    __y._M_str = in_stack_fffffffffffffe80;
    __y._M_len = in_stack_fffffffffffffe78;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
      ::operator*(&local_38);
      local_e8 = (memory_resource *)
                 allocator_holder<std::pmr::polymorphic_allocator<char>_>::get_allocator(in_RDI);
      basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>::
      basic_json<std::pmr::polymorphic_allocator<char>>
                ((basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                  *)in_stack_fffffffffffffe70,
                 (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                  *)in_stack_fffffffffffffe68,
                 (polymorphic_allocator<char> *)in_stack_fffffffffffffe60);
      key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
      ::
      value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
                (in_stack_fffffffffffffe60,
                 (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                  *)in_stack_fffffffffffffe58);
      basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                  *)0xdb82ab);
    }
    else {
      this_01 = (basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                 *)(in_RDI + 1);
      __gnu_cxx::
      __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>const*,std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>>
      ::
      __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*>
                ((__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe60,
                 (__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe60 =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
            *)std::basic_string_view<char,_std::char_traits<char>_>::begin(local_20);
      __args = (basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_> *
               )std::basic_string_view<char,_std::char_traits<char>_>::end(local_20);
      allocator_holder<std::pmr::polymorphic_allocator<char>_>::get_allocator(in_RDI);
      __position._M_current = &local_120;
      std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>
      ::basic_string<char_const*,void>
                (this_01,(char *)__args,(char *)in_stack_fffffffffffffe60,
                 (polymorphic_allocator<char> *)in_stack_fffffffffffffe58);
      local_120.value_.field_0.int64_.val_ =
           (int64_t)std::
                    vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>
                    ::
                    emplace<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>
                              ((vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>
                                *)this_01,__position,__args,
                               (basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>
                                *)in_stack_fffffffffffffe60);
      local_38._M_current =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>
            *)local_120.value_.field_0.int64_.val_;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>
                     *)0xdb83ab);
    }
    local_29 = !bVar1;
  }
  pVar2 = std::
          make_pair<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>*,std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>,std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,std::char_traits<char>,std::pmr::polymorphic_allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::pmr::polymorphic_allocator<char>>>>>>&,bool&>
                    ((__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>,_std::pmr::polymorphic_allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::pmr::polymorphic_allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::pmr::polymorphic_allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffe60,(bool *)in_stack_fffffffffffffe58);
  tVar3.first._M_current = pVar2.first._M_current;
  tVar3.second = pVar2.second;
  tVar3._9_7_ = pVar2._9_7_;
  return tVar3;
}

Assistant:

typename std::enable_if<!std::allocator_traits<A>::is_always_equal::value,std::pair<iterator,bool>>::type
        insert_or_assign(const string_view_type& name, T&& value)
        {
            bool inserted;
            auto it = std::lower_bound(members_.begin(),members_.end(), name, 
                                       Comp());        
            if (it == members_.end())
            {
                members_.emplace_back(key_type(name.begin(),name.end(), get_allocator()), std::forward<T>(value));
                inserted = true;
                it = members_.begin() + members_.size() - 1;
            }
            else if ((*it).key() == name)
            {
                (*it).value(Json(std::forward<T>(value), get_allocator()));
                inserted = false; // assigned
            }
            else
            {
                it = members_.emplace(it, key_type(name.begin(),name.end(), get_allocator()),
                    std::forward<T>(value));
                inserted = true;
            }
            return std::make_pair(it,inserted);
        }